

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationVP.cpp
# Opt level: O1

void __thiscall DIS::SeparationVP::SeparationVP(SeparationVP *this)

{
  this->_vptr_SeparationVP = (_func_int **)&PTR__SeparationVP_001b5e80;
  this->_recordType = '\x04';
  this->_reasonForSeparation = '\0';
  this->_preEntityIndicator = '\0';
  this->_padding1 = '\0';
  EntityID::EntityID(&this->_parentEntityID);
  this->_padding2 = 0;
  this->_stationLocation = 0;
  return;
}

Assistant:

SeparationVP::SeparationVP():
   _recordType(4), 
   _reasonForSeparation(0), 
   _preEntityIndicator(0), 
   _padding1(0), 
   _parentEntityID(), 
   _padding2(0), 
   _stationLocation(0)
{
}